

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

QueueType * __thiscall
slang::BumpAllocator::emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int_const&>
          (BumpAllocator *this,Type *args,uint *args_1)

{
  QueueType *this_00;
  
  this_00 = (QueueType *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((QueueType *)this->endPtr < this_00 + 1) {
    this_00 = (QueueType *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::QueueType::QueueType(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }